

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

int run_test_threadpool_cancel_getaddrinfo(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_loop_t *loop;
  addrinfo hints;
  cancel_info ci;
  uv_getaddrinfo_t reqs [4];
  
  hints.ai_next = (addrinfo *)&ci.timer_handle.start_id;
  ci.reqs._0_4_ = 4;
  ci.reqs._4_4_ = 0xa0;
  loop_00 = uv_default_loop();
  saturate_threadpool();
  iVar1 = uv_getaddrinfo(loop_00,(uv_getaddrinfo_t *)&ci.timer_handle.start_id,getaddrinfo_cb,"fail"
                         ,(char *)0x0,(addrinfo *)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xd4,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_getaddrinfo(loop_00,(uv_getaddrinfo_t *)&reqs[0].retcode,getaddrinfo_cb,(char *)0x0,
                         "fail",(addrinfo *)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xd7,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_getaddrinfo(loop_00,(uv_getaddrinfo_t *)&reqs[1].retcode,getaddrinfo_cb,"fail","fail",
                         (addrinfo *)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xda,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_getaddrinfo(loop_00,(uv_getaddrinfo_t *)&reqs[2].retcode,getaddrinfo_cb,"fail",
                         (char *)0x0,(addrinfo *)&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xdd,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_init(loop_00,(uv_timer_t *)&ci.nreqs);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xdf,"uv_timer_init(loop, &ci.timer_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start((uv_timer_t *)&ci.nreqs,timer_cb,10,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xe0,"uv_timer_start(&ci.timer_handle, timer_cb, 10, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xe1,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((ulong)timer_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xe2,"1","==","timer_cb_called",1,"==",(ulong)timer_cb_called);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xe4,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(threadpool_cancel_getaddrinfo) {
  uv_getaddrinfo_t reqs[4];
  struct cancel_info ci;
  struct addrinfo hints;
  uv_loop_t* loop;
  int r;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  r = uv_getaddrinfo(loop, reqs + 0, getaddrinfo_cb, "fail", NULL, NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 1, getaddrinfo_cb, NULL, "fail", NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 2, getaddrinfo_cb, "fail", "fail", NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 3, getaddrinfo_cb, "fail", NULL, &hints);
  ASSERT_OK(r);

  ASSERT_OK(uv_timer_init(loop, &ci.timer_handle));
  ASSERT_OK(uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, timer_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}